

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsStorage.cpp
# Opt level: O1

void __thiscall
vkt::sparse::SparseShaderIntrinsicsCaseStorage::initPrograms
          (SparseShaderIntrinsicsCaseStorage *this,SourceCollections *programCollection)

{
  TextureFormat *format;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ImageType imageType;
  SourceCollections *pSVar2;
  ostream *poVar3;
  SpirVAsmSource *src_00;
  ImageType in_ECX;
  ImageType imageType_00;
  TextureFormat *format_00;
  TextureFormat *format_01;
  TextureFormat *format_02;
  TextureFormat *format_03;
  string typeImgCompVec4;
  string typeImgComp;
  string coordString;
  string typeUniformConstImageSparse;
  string typeImageSparse;
  string formatQualStr;
  string formatDataStr;
  string imageTypeStr;
  ostringstream src;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  long *local_310 [2];
  long local_300 [2];
  SourceCollections *local_2f0;
  long *local_2e8 [2];
  long local_2d8 [2];
  long *local_2c8 [2];
  long local_2b8 [2];
  long *local_2a8;
  long local_2a0;
  long local_298 [2];
  string local_288;
  long *local_268;
  long local_260;
  long local_258 [2];
  long *local_248;
  long local_240;
  long local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  format = &(this->super_SparseShaderIntrinsicsCaseBase).m_format;
  getShaderImageType_abi_cxx11_
            (&local_1c8,(sparse *)format,
             (TextureFormat *)(ulong)(this->super_SparseShaderIntrinsicsCaseBase).m_imageType,in_ECX
            );
  getShaderImageDataType_abi_cxx11_(&local_1e8,(sparse *)format,format_00);
  getShaderImageFormatQualifier_abi_cxx11_(&local_208,(sparse *)format,format_01);
  imageType = (this->super_SparseShaderIntrinsicsCaseBase).m_imageType;
  local_2f0 = programCollection;
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"%local_int_GlobalInvocationID_x","");
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_390,"%local_ivec2_GlobalInvocationID_xy","");
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3b0,"%local_ivec3_GlobalInvocationID_xyz","");
  getShaderImageCoordinates(&local_330,imageType,local_1a8,&local_390,&local_3b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  getImageComponentTypeName_abi_cxx11_(&local_390,(sparse *)format,format_02);
  getImageComponentVec4TypeName_abi_cxx11_(&local_3b0,(sparse *)format,format_03);
  (*(this->super_SparseShaderIntrinsicsCaseBase).super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[7])(&local_248,this);
  (*(this->super_SparseShaderIntrinsicsCaseBase).super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[8])(&local_268,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpCapability Shader\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpCapability ImageCubeArray\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpCapability SparseResidency\n",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpCapability StorageImageExtendedFormats\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"%ext_import = OpExtInstImport \"GLSL.std.450\"\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpMemoryModel Logical GLSL450\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "OpEntryPoint GLCompute %func_main \"main\" %input_GlobalInvocationID\n",0x43);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpExecutionMode %func_main LocalSize 1 1 1\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpSource GLSL 440\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpName %func_main \"main\"\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpName %input_GlobalInvocationID \"gl_GlobalInvocationID\"\n",
             0x39);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpName %input_WorkGroupSize \"gl_WorkGroupSize\"\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpName %uniform_image_sparse \"u_imageSparse\"\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpName %uniform_image_texels \"u_imageTexels\"\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpName %uniform_image_residency \"u_imageResidency\"\n",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "OpDecorate %input_GlobalInvocationID BuiltIn GlobalInvocationId\n",0x40);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpDecorate %input_WorkGroupSize BuiltIn WorkgroupSize\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpDecorate %constant_uint_grid_x SpecId 1\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpDecorate %constant_uint_grid_y SpecId 2\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpDecorate %constant_uint_grid_z SpecId 3\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpDecorate %constant_uint_work_group_size_x SpecId 4\n",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpDecorate %constant_uint_work_group_size_y SpecId 5\n",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpDecorate %constant_uint_work_group_size_z SpecId 6\n",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpDecorate %uniform_image_sparse DescriptorSet 0\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"OpDecorate %uniform_image_sparse Binding ",0x29);
  poVar3 = (ostream *)std::ostream::operator<<(local_1a8,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"OpDecorate %uniform_image_texels DescriptorSet 0\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"OpDecorate %uniform_image_texels Binding ",0x29);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"OpDecorate %uniform_image_texels NonReadable\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"OpDecorate %uniform_image_residency DescriptorSet 0\n",0x34);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"OpDecorate %uniform_image_residency Binding ",0x2c);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"OpDecorate %uniform_image_residency NonReadable\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%type_bool\t\t\t\t\t\t= OpTypeBool\n",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%type_int\t\t\t\t\t\t= OpTypeInt 32 1\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%type_uint\t\t\t\t\t\t= OpTypeInt 32 0\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%type_ivec2\t\t\t\t\t\t= OpTypeVector %type_int  2\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%type_ivec3\t\t\t\t\t\t= OpTypeVector %type_int  3\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%type_ivec4\t\t\t\t\t\t= OpTypeVector %type_int  4\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%type_uvec3\t\t\t\t\t\t= OpTypeVector %type_uint 3\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%type_uvec4\t\t\t\t\t\t= OpTypeVector %type_uint 4\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%type_struct_int_img_comp_vec4\t= OpTypeStruct %type_int ",0x38);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_3b0._M_dataplus._M_p,local_3b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%type_input_uint\t\t= OpTypePointer Input %type_uint\n",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%type_input_uvec3\t\t= OpTypePointer Input %type_uvec3\n",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%type_function_int\t\t\t = OpTypePointer Function %type_int\n",0x39);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%type_function_img_comp_vec4 = OpTypePointer Function ",0x36);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_3b0._M_dataplus._M_p,local_3b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%type_void\t\t\t\t= OpTypeVoid\n",0x1b)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%type_void_func\t\t\t= OpTypeFunction %type_void\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%type_image_sparse = ",0x15);
  getOpTypeImageSparse
            (&local_350,(this->super_SparseShaderIntrinsicsCaseBase).m_imageType,format,&local_390,
             false);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_350._M_dataplus._M_p,local_350._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%type_uniformconst_image_sparse = OpTypePointer UniformConstant %type_image_sparse\n",
             0x53);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%type_image_sparse_with_sampler = ",0x22);
  getOpTypeImageSparse
            (&local_370,(this->super_SparseShaderIntrinsicsCaseBase).m_imageType,format,&local_390,
             true);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_370._M_dataplus._M_p,local_370._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%type_uniformconst_image_sparse_with_sampler = OpTypePointer UniformConstant %type_image_sparse_with_sampler\n"
             ,0x6d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%type_image_residency\t\t\t\t= ",0x1b);
  getOpTypeImageResidency_abi_cxx11_
            (&local_288,(sparse *)(ulong)(this->super_SparseShaderIntrinsicsCaseBase).m_imageType,
             imageType_00);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_288._M_dataplus._M_p,local_288._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%type_uniformconst_image_residency\t= OpTypePointer UniformConstant %type_image_residency\n"
             ,0x59);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%uniform_image_sparse = OpVariable ",0x23);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_268,local_260);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," UniformConstant\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%uniform_image_texels = OpVariable %type_uniformconst_image_sparse UniformConstant\n",
             0x53);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%uniform_image_residency = OpVariable %type_uniformconst_image_residency UniformConstant\n"
             ,0x59);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%input_GlobalInvocationID = OpVariable %type_input_uvec3 Input\n",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%constant_uint_grid_x\t\t\t\t= OpSpecConstant %type_uint 1\n",0x37);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%constant_uint_grid_y\t\t\t\t= OpSpecConstant %type_uint 1\n",0x37);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%constant_uint_grid_z\t\t\t\t= OpSpecConstant %type_uint 1\n",0x37);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%constant_uint_work_group_size_x\t= OpSpecConstant %type_uint 1\n",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%constant_uint_work_group_size_y\t= OpSpecConstant %type_uint 1\n",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%constant_uint_work_group_size_z\t= OpSpecConstant %type_uint 1\n",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%input_WorkGroupSize = OpSpecConstantComposite %type_uvec3 %constant_uint_work_group_size_x %constant_uint_work_group_size_y %constant_uint_work_group_size_z\n"
             ,0x9e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%constant_uint_0\t\t\t\t= OpConstant %type_uint 0\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%constant_uint_1\t\t\t\t= OpConstant %type_uint 1\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%constant_uint_2\t\t\t\t= OpConstant %type_uint 2\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%constant_int_0\t\t\t\t\t= OpConstant %type_int 0\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%constant_int_1\t\t\t\t\t= OpConstant %type_int 1\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%constant_int_2\t\t\t\t\t= OpConstant %type_int 2\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%constant_bool_true\t\t\t\t= OpConstantTrue %type_bool\n",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%constant_uint_resident\t\t\t= OpConstant %type_uint ",0x32);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%constant_uvec4_resident\t\t= OpConstantComposite %type_uvec4 %constant_uint_resident %constant_uint_resident %constant_uint_resident %constant_uint_resident\n"
             ,0x9c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%constant_uint_not_resident\t\t= OpConstant %type_uint ",0x35);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%constant_uvec4_not_resident\t= OpConstantComposite %type_uvec4 %constant_uint_not_resident %constant_uint_not_resident %constant_uint_not_resident %constant_uint_not_resident\n"
             ,0xaf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%func_main\t\t = OpFunction %type_void None %type_void_func\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%label_func_main = OpLabel\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%access_GlobalInvocationID_x\t\t= OpAccessChain %type_input_uint %input_GlobalInvocationID %constant_uint_0\n"
             ,0x6a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%local_uint_GlobalInvocationID_x\t= OpLoad %type_uint %access_GlobalInvocationID_x\n",
             0x52);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%local_int_GlobalInvocationID_x\t\t= OpBitcast %type_int %local_uint_GlobalInvocationID_x\n"
             ,0x58);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%access_GlobalInvocationID_y\t\t= OpAccessChain %type_input_uint %input_GlobalInvocationID %constant_uint_1\n"
             ,0x6a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%local_uint_GlobalInvocationID_y\t= OpLoad %type_uint %access_GlobalInvocationID_y\n",
             0x52);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%local_int_GlobalInvocationID_y\t\t= OpBitcast %type_int %local_uint_GlobalInvocationID_y\n"
             ,0x58);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%access_GlobalInvocationID_z\t\t= OpAccessChain %type_input_uint %input_GlobalInvocationID %constant_uint_2\n"
             ,0x6a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%local_uint_GlobalInvocationID_z\t= OpLoad %type_uint %access_GlobalInvocationID_z\n",
             0x52);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%local_int_GlobalInvocationID_z\t\t= OpBitcast %type_int %local_uint_GlobalInvocationID_z\n"
             ,0x58);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%local_ivec2_GlobalInvocationID_xy\t= OpCompositeConstruct %type_ivec2 %local_int_GlobalInvocationID_x %local_int_GlobalInvocationID_y\n"
             ,0x86);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%local_ivec3_GlobalInvocationID_xyz = OpCompositeConstruct %type_ivec3 %local_int_GlobalInvocationID_x %local_int_GlobalInvocationID_y %local_int_GlobalInvocationID_z\n"
             ,0xa7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%comparison_range_x = OpULessThan %type_bool %local_uint_GlobalInvocationID_x %constant_uint_grid_x\n"
             ,100);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"OpSelectionMerge %label_out_range_x None\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"OpBranchConditional %comparison_range_x %label_in_range_x %label_out_range_x\n"
             ,0x4d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%label_in_range_x = OpLabel\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%comparison_range_y = OpULessThan %type_bool %local_uint_GlobalInvocationID_y %constant_uint_grid_y\n"
             ,100);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"OpSelectionMerge %label_out_range_y None\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"OpBranchConditional %comparison_range_y %label_in_range_y %label_out_range_y\n"
             ,0x4d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%label_in_range_y = OpLabel\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%comparison_range_z = OpULessThan %type_bool %local_uint_GlobalInvocationID_z %constant_uint_grid_z\n"
             ,100);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"OpSelectionMerge %label_out_range_z None\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"OpBranchConditional %comparison_range_z %label_in_range_z %label_out_range_z\n"
             ,0x4d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%label_in_range_z = OpLabel\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%local_image_sparse = OpLoad ",0x1d);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_248,local_240);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," %uniform_image_sparse\n",0x17);
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"%local_sparse_op_result","");
  local_310[0] = local_300;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_310,"%type_struct_int_img_comp_vec4","");
  local_2e8[0] = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"%local_image_sparse","");
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"%constant_int_0","");
  (*(this->super_SparseShaderIntrinsicsCaseBase).super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[9])(&local_2a8,this,local_2c8,local_310,local_2e8,&local_330,(string *)local_228)
  ;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_2a8,local_2a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%local_img_comp_vec4 = OpCompositeExtract ",0x2a);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_3b0._M_dataplus._M_p,local_3b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," %local_sparse_op_result 1\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%local_residency_code = OpCompositeExtract %type_int %local_sparse_op_result 0\n",0x4f
            );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%local_image_texels = OpLoad %type_image_sparse %uniform_image_texels\n",0x46);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"OpImageWrite %local_image_texels ",0x21);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_330._M_dataplus._M_p,local_330._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," %local_img_comp_vec4\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%local_image_residency\t= OpLoad %type_image_residency %uniform_image_residency\n",
             0x4f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "%local_texel_resident = OpImageSparseTexelsResident %type_bool %local_residency_code\n"
             ,0x55);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"OpSelectionMerge %branch_texel_resident None\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "OpBranchConditional %local_texel_resident %label_texel_resident %label_texel_not_resident\n"
             ,0x5a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%label_texel_resident = OpLabel\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"OpImageWrite %local_image_residency ",0x24);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_330._M_dataplus._M_p,local_330._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," %constant_uvec4_resident\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"OpBranch %branch_texel_resident\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%label_texel_not_resident = OpLabel\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"OpImageWrite %local_image_residency ",0x24);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_330._M_dataplus._M_p,local_330._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," %constant_uvec4_not_resident\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"OpBranch %branch_texel_resident\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"%branch_texel_resident = OpLabel\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"OpBranch %label_out_range_z\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%label_out_range_z = OpLabel\n",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"OpBranch %label_out_range_y\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%label_out_range_y = OpLabel\n",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"OpBranch %label_out_range_x\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%label_out_range_x = OpLabel\n",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"OpReturn\n",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"OpFunctionEnd\n",0xe);
  if (local_2a8 != local_298) {
    operator_delete(local_2a8,local_298[0] + 1);
  }
  if (local_228[0] != local_218) {
    operator_delete(local_228[0],local_218[0] + 1);
  }
  if (local_2e8[0] != local_2d8) {
    operator_delete(local_2e8[0],local_2d8[0] + 1);
  }
  if (local_310[0] != local_300) {
    operator_delete(local_310[0],local_300[0] + 1);
  }
  pSVar2 = local_2f0;
  if (local_2c8[0] != local_2b8) {
    operator_delete(local_2c8[0],local_2b8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_350.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != paVar1) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  local_350._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"compute","");
  src_00 = ::vk::ProgramCollection<vk::SpirVAsmSource>::add(&pSVar2->spirvAsmSources,&local_350);
  std::__cxx11::stringbuf::str();
  ::vk::operator<<(src_00,&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != paVar1) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if (local_268 != local_258) {
    operator_delete(local_268,local_258[0] + 1);
  }
  if (local_248 != local_238) {
    operator_delete(local_248,local_238[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SparseShaderIntrinsicsCaseStorage::initPrograms (vk::SourceCollections& programCollection) const
{
	const std::string	imageTypeStr	= getShaderImageType(m_format, m_imageType);
	const std::string	formatDataStr	= getShaderImageDataType(m_format);
	const std::string	formatQualStr	= getShaderImageFormatQualifier(m_format);

	const std::string  coordString		= getShaderImageCoordinates(m_imageType,
																	"%local_int_GlobalInvocationID_x",
																	"%local_ivec2_GlobalInvocationID_xy",
																	"%local_ivec3_GlobalInvocationID_xyz");
	// Create compute program
	std::ostringstream	src;

	const std::string	typeImgComp					= getImageComponentTypeName(m_format);
	const std::string	typeImgCompVec4				= getImageComponentVec4TypeName(m_format);
	const std::string	typeImageSparse				= getSparseImageTypeName();
	const std::string	typeUniformConstImageSparse	= getUniformConstSparseImageTypeName();

	src << "OpCapability Shader\n"
		<< "OpCapability ImageCubeArray\n"
		<< "OpCapability SparseResidency\n"
		<< "OpCapability StorageImageExtendedFormats\n"

		<< "%ext_import = OpExtInstImport \"GLSL.std.450\"\n"
		<< "OpMemoryModel Logical GLSL450\n"
		<< "OpEntryPoint GLCompute %func_main \"main\" %input_GlobalInvocationID\n"
		<< "OpExecutionMode %func_main LocalSize 1 1 1\n"
		<< "OpSource GLSL 440\n"

		<< "OpName %func_main \"main\"\n"

		<< "OpName %input_GlobalInvocationID \"gl_GlobalInvocationID\"\n"
		<< "OpName %input_WorkGroupSize \"gl_WorkGroupSize\"\n"

		<< "OpName %uniform_image_sparse \"u_imageSparse\"\n"
		<< "OpName %uniform_image_texels \"u_imageTexels\"\n"
		<< "OpName %uniform_image_residency \"u_imageResidency\"\n"

		<< "OpDecorate %input_GlobalInvocationID BuiltIn GlobalInvocationId\n"

		<< "OpDecorate %input_WorkGroupSize BuiltIn WorkgroupSize\n"

		<< "OpDecorate %constant_uint_grid_x SpecId 1\n"
		<< "OpDecorate %constant_uint_grid_y SpecId 2\n"
		<< "OpDecorate %constant_uint_grid_z SpecId 3\n"

		<< "OpDecorate %constant_uint_work_group_size_x SpecId 4\n"
		<< "OpDecorate %constant_uint_work_group_size_y SpecId 5\n"
		<< "OpDecorate %constant_uint_work_group_size_z SpecId 6\n"

		<< "OpDecorate %uniform_image_sparse DescriptorSet 0\n"
		<< "OpDecorate %uniform_image_sparse Binding " << BINDING_IMAGE_SPARSE << "\n"

		<< "OpDecorate %uniform_image_texels DescriptorSet 0\n"
		<< "OpDecorate %uniform_image_texels Binding " << BINDING_IMAGE_TEXELS << "\n"
		<< "OpDecorate %uniform_image_texels NonReadable\n"

		<< "OpDecorate %uniform_image_residency DescriptorSet 0\n"
		<< "OpDecorate %uniform_image_residency Binding " << BINDING_IMAGE_RESIDENCY << "\n"
		<< "OpDecorate %uniform_image_residency NonReadable\n"

		// Declare data types
		<< "%type_bool						= OpTypeBool\n"
		<< "%type_int						= OpTypeInt 32 1\n"
		<< "%type_uint						= OpTypeInt 32 0\n"
		<< "%type_ivec2						= OpTypeVector %type_int  2\n"
		<< "%type_ivec3						= OpTypeVector %type_int  3\n"
		<< "%type_ivec4						= OpTypeVector %type_int  4\n"
		<< "%type_uvec3						= OpTypeVector %type_uint 3\n"
		<< "%type_uvec4						= OpTypeVector %type_uint 4\n"
		<< "%type_struct_int_img_comp_vec4	= OpTypeStruct %type_int " << typeImgCompVec4 << "\n"

		<< "%type_input_uint		= OpTypePointer Input %type_uint\n"
		<< "%type_input_uvec3		= OpTypePointer Input %type_uvec3\n"

		<< "%type_function_int			 = OpTypePointer Function %type_int\n"
		<< "%type_function_img_comp_vec4 = OpTypePointer Function " << typeImgCompVec4 << "\n"

		<< "%type_void				= OpTypeVoid\n"
		<< "%type_void_func			= OpTypeFunction %type_void\n"

		// Sparse image without sampler type declaration
		<< "%type_image_sparse = " << getOpTypeImageSparse(m_imageType, m_format, typeImgComp, false) << "\n"
		<< "%type_uniformconst_image_sparse = OpTypePointer UniformConstant %type_image_sparse\n"

		// Sparse image with sampler type declaration
		<< "%type_image_sparse_with_sampler = " << getOpTypeImageSparse(m_imageType, m_format, typeImgComp, true) << "\n"
		<< "%type_uniformconst_image_sparse_with_sampler = OpTypePointer UniformConstant %type_image_sparse_with_sampler\n"

		// Residency image type declaration
		<< "%type_image_residency				= " << getOpTypeImageResidency(m_imageType) << "\n"
		<< "%type_uniformconst_image_residency	= OpTypePointer UniformConstant %type_image_residency\n"

		// Declare sparse image variable
		<< "%uniform_image_sparse = OpVariable " << typeUniformConstImageSparse << " UniformConstant\n"

		// Declare output image variable for storing texels
		<< "%uniform_image_texels = OpVariable %type_uniformconst_image_sparse UniformConstant\n"

		// Declare output image variable for storing residency information
		<< "%uniform_image_residency = OpVariable %type_uniformconst_image_residency UniformConstant\n"

		// Declare input variables
		<< "%input_GlobalInvocationID = OpVariable %type_input_uvec3 Input\n"

		<< "%constant_uint_grid_x				= OpSpecConstant %type_uint 1\n"
		<< "%constant_uint_grid_y				= OpSpecConstant %type_uint 1\n"
		<< "%constant_uint_grid_z				= OpSpecConstant %type_uint 1\n"

		<< "%constant_uint_work_group_size_x	= OpSpecConstant %type_uint 1\n"
		<< "%constant_uint_work_group_size_y	= OpSpecConstant %type_uint 1\n"
		<< "%constant_uint_work_group_size_z	= OpSpecConstant %type_uint 1\n"
		<< "%input_WorkGroupSize = OpSpecConstantComposite %type_uvec3 %constant_uint_work_group_size_x %constant_uint_work_group_size_y %constant_uint_work_group_size_z\n"

		// Declare constants
		<< "%constant_uint_0				= OpConstant %type_uint 0\n"
		<< "%constant_uint_1				= OpConstant %type_uint 1\n"
		<< "%constant_uint_2				= OpConstant %type_uint 2\n"
		<< "%constant_int_0					= OpConstant %type_int 0\n"
		<< "%constant_int_1					= OpConstant %type_int 1\n"
		<< "%constant_int_2					= OpConstant %type_int 2\n"
		<< "%constant_bool_true				= OpConstantTrue %type_bool\n"
		<< "%constant_uint_resident			= OpConstant %type_uint " << MEMORY_BLOCK_BOUND_VALUE << "\n"
		<< "%constant_uvec4_resident		= OpConstantComposite %type_uvec4 %constant_uint_resident %constant_uint_resident %constant_uint_resident %constant_uint_resident\n"
		<< "%constant_uint_not_resident		= OpConstant %type_uint " << MEMORY_BLOCK_NOT_BOUND_VALUE << "\n"
		<< "%constant_uvec4_not_resident	= OpConstantComposite %type_uvec4 %constant_uint_not_resident %constant_uint_not_resident %constant_uint_not_resident %constant_uint_not_resident\n"

		// Call main function
		<< "%func_main		 = OpFunction %type_void None %type_void_func\n"
		<< "%label_func_main = OpLabel\n"

		// Load GlobalInvocationID.xyz into local variables
		<< "%access_GlobalInvocationID_x		= OpAccessChain %type_input_uint %input_GlobalInvocationID %constant_uint_0\n"
		<< "%local_uint_GlobalInvocationID_x	= OpLoad %type_uint %access_GlobalInvocationID_x\n"
		<< "%local_int_GlobalInvocationID_x		= OpBitcast %type_int %local_uint_GlobalInvocationID_x\n"

		<< "%access_GlobalInvocationID_y		= OpAccessChain %type_input_uint %input_GlobalInvocationID %constant_uint_1\n"
		<< "%local_uint_GlobalInvocationID_y	= OpLoad %type_uint %access_GlobalInvocationID_y\n"
		<< "%local_int_GlobalInvocationID_y		= OpBitcast %type_int %local_uint_GlobalInvocationID_y\n"

		<< "%access_GlobalInvocationID_z		= OpAccessChain %type_input_uint %input_GlobalInvocationID %constant_uint_2\n"
		<< "%local_uint_GlobalInvocationID_z	= OpLoad %type_uint %access_GlobalInvocationID_z\n"
		<< "%local_int_GlobalInvocationID_z		= OpBitcast %type_int %local_uint_GlobalInvocationID_z\n"

		<< "%local_ivec2_GlobalInvocationID_xy	= OpCompositeConstruct %type_ivec2 %local_int_GlobalInvocationID_x %local_int_GlobalInvocationID_y\n"
		<< "%local_ivec3_GlobalInvocationID_xyz = OpCompositeConstruct %type_ivec3 %local_int_GlobalInvocationID_x %local_int_GlobalInvocationID_y %local_int_GlobalInvocationID_z\n"

		<< "%comparison_range_x = OpULessThan %type_bool %local_uint_GlobalInvocationID_x %constant_uint_grid_x\n"
		<< "OpSelectionMerge %label_out_range_x None\n"
		<< "OpBranchConditional %comparison_range_x %label_in_range_x %label_out_range_x\n"
		<< "%label_in_range_x = OpLabel\n"

		<< "%comparison_range_y = OpULessThan %type_bool %local_uint_GlobalInvocationID_y %constant_uint_grid_y\n"
		<< "OpSelectionMerge %label_out_range_y None\n"
		<< "OpBranchConditional %comparison_range_y %label_in_range_y %label_out_range_y\n"
		<< "%label_in_range_y = OpLabel\n"

		<< "%comparison_range_z = OpULessThan %type_bool %local_uint_GlobalInvocationID_z %constant_uint_grid_z\n"
		<< "OpSelectionMerge %label_out_range_z None\n"
		<< "OpBranchConditional %comparison_range_z %label_in_range_z %label_out_range_z\n"
		<< "%label_in_range_z = OpLabel\n"

		// Load sparse image
		<< "%local_image_sparse = OpLoad " << typeImageSparse << " %uniform_image_sparse\n"

		// Call OpImageSparse*
		<< sparseImageOpString("%local_sparse_op_result", "%type_struct_int_img_comp_vec4", "%local_image_sparse", coordString, "%constant_int_0") << "\n"

		// Load the texel from the sparse image to local variable for OpImageSparse*
		<< "%local_img_comp_vec4 = OpCompositeExtract " << typeImgCompVec4 << " %local_sparse_op_result 1\n"

		// Load residency code for OpImageSparse*
		<< "%local_residency_code = OpCompositeExtract %type_int %local_sparse_op_result 0\n"
		// End Call OpImageSparse*

		// Load texels image
		<< "%local_image_texels = OpLoad %type_image_sparse %uniform_image_texels\n"

		// Write the texel to output image via OpImageWrite
		<< "OpImageWrite %local_image_texels " << coordString << " %local_img_comp_vec4\n"

		// Load residency info image
		<< "%local_image_residency	= OpLoad %type_image_residency %uniform_image_residency\n"

		// Check if loaded texel is placed in resident memory
		<< "%local_texel_resident = OpImageSparseTexelsResident %type_bool %local_residency_code\n"
		<< "OpSelectionMerge %branch_texel_resident None\n"
		<< "OpBranchConditional %local_texel_resident %label_texel_resident %label_texel_not_resident\n"
		<< "%label_texel_resident = OpLabel\n"

		// Loaded texel is in resident memory
		<< "OpImageWrite %local_image_residency " << coordString << " %constant_uvec4_resident\n"

		<< "OpBranch %branch_texel_resident\n"
		<< "%label_texel_not_resident = OpLabel\n"

		// Loaded texel is not in resident memory
		<< "OpImageWrite %local_image_residency " << coordString << " %constant_uvec4_not_resident\n"

		<< "OpBranch %branch_texel_resident\n"
		<< "%branch_texel_resident = OpLabel\n"

		<< "OpBranch %label_out_range_z\n"
		<< "%label_out_range_z = OpLabel\n"

		<< "OpBranch %label_out_range_y\n"
		<< "%label_out_range_y = OpLabel\n"

		<< "OpBranch %label_out_range_x\n"
		<< "%label_out_range_x = OpLabel\n"

		<< "OpReturn\n"
		<< "OpFunctionEnd\n";

	programCollection.spirvAsmSources.add("compute") << src.str();
}